

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::
initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper::RunImpl
          (initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper
           *this)

{
  Message *pMVar1;
  TestResults *pTVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  UtcTimeStamp *val;
  UtcTimeStamp *val_00;
  TestDetails local_930;
  int local_910 [10];
  TestDetails local_8e8;
  int local_8c8 [2];
  UtcTimeStamp local_8c0;
  ResendRequest local_8a8;
  undefined1 local_750 [8];
  Message resendReq;
  UtcTimeStamp local_5f8;
  Logon local_5e0;
  undefined1 local_488 [8];
  Message receivedLogon;
  Logon local_320;
  Message local_1c8 [8];
  Message sentLogon;
  UtcTimeOnly local_70;
  UtcTimeOnly local_58;
  UtcTimeStamp local_40;
  UtcTimeStamp local_28;
  initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper *local_10;
  initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper *this_local
  ;
  
  local_10 = this;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_28,8,8,8,0xd,5,0x7df);
  val = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp;
  FIX::UtcTimeStamp::operator=(val,&local_28);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_28);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_40,0x10,0x10,0x10,0xd,5,0x898);
  val_00 = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp;
  FIX::UtcTimeStamp::operator=(val_00,&local_40);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_40);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_58,&val->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime,
             &local_58);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_58);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_70,&val_00->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime,
             &local_70);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_70);
  (*(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
    _vptr_Responder[8])();
  FIX::Session::setPersistMessages((this->super_initiatorFixture).super_sessionFixture.object,false)
  ;
  createLogon(&local_320,"TW","ISLD",1);
  FIX::Message::Message(local_1c8,(Message *)&local_320);
  FIX42::Logon::~Logon(&local_320);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon(&local_5e0,"ISLD","TW",1);
  FIX::Message::Message((Message *)local_488,(Message *)&local_5e0);
  FIX42::Logon::~Logon(&local_5e0);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_5f8);
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_488,SUB81(&local_5f8,0));
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_5f8);
  FIX::Session::setNextSenderMsgSeqNum((this->super_initiatorFixture).super_sessionFixture.object,5)
  ;
  createResendRequest(&local_8a8,"ISLD","TW",2,1,10);
  FIX::Message::Message((Message *)local_750,(Message *)&local_8a8);
  FIX42::ResendRequest::~ResendRequest(&local_8a8);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_8c0);
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_750,SUB81(&local_8c0,0));
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_8c0);
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar3;
  local_8c8[1] = 5;
  local_8c8[0] = FIX::Session::getExpectedSenderNum
                           ((this->super_initiatorFixture).super_sessionFixture.object);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8e8,*ppTVar4,0x818);
  UnitTest::CheckEqual<int,int>(pTVar2,local_8c8 + 1,local_8c8,&local_8e8);
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar3;
  local_910[1] = 2;
  local_910[0] = FIX::Session::getExpectedTargetNum
                           ((this->super_initiatorFixture).super_sessionFixture.object);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_930,*ppTVar4,0x819);
  UnitTest::CheckEqual<int,int>(pTVar2,local_910 + 1,local_910,&local_930);
  FIX::Message::~Message((Message *)local_750);
  FIX::Message::~Message((Message *)local_488);
  FIX::Message::~Message(local_1c8);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNums) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  object->setPersistMessages(false);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  object->setNextSenderMsgSeqNum(5);

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 10);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(5, object->getExpectedSenderNum());
  CHECK_EQUAL(2, object->getExpectedTargetNum());

}